

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

uint __thiscall
QFragmentMapData<QTextBlockData>::insert_single
          (QFragmentMapData<QTextBlockData> *this,int key,uint length)

{
  quint32 qVar1;
  uint index;
  uint index_00;
  QTextBlockData *pQVar2;
  quint32 in_EDX;
  uint in_ESI;
  anon_union_8_2_e778645c_for_QFragmentMapData<QTextBlockData>_1 *in_RDI;
  bool bVar3;
  uint field_3;
  uint p;
  uint field_2;
  bool right;
  uint s;
  uint x;
  uint y;
  uint field_1;
  uint field;
  uint z;
  undefined4 in_stack_ffffffffffffffc0;
  uint local_38;
  uint local_30;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  
  index_00 = createFragment((QFragmentMapData<QTextBlockData> *)in_RDI);
  pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
  (pQVar2->super_QFragment<3>).left = 0;
  pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
  (pQVar2->super_QFragment<3>).right = 0;
  pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
  (pQVar2->super_QFragment<3>).size_array[0] = in_EDX;
  for (local_18 = 1; local_18 < 3; local_18 = local_18 + 1) {
    pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
    (pQVar2->super_QFragment<3>).size_array[local_18] = 1;
  }
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
    (pQVar2->super_QFragment<3>).size_left_array[local_1c] = 0;
  }
  local_20 = 0;
  local_24 = root((QFragmentMapData<QTextBlockData> *)in_RDI);
  bVar3 = false;
  local_28 = in_ESI;
  while (local_24 != 0) {
    local_20 = local_24;
    pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_24);
    bVar3 = (pQVar2->super_QFragment<3>).size_left_array[0] < local_28;
    if (bVar3) {
      pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_24);
      qVar1 = (pQVar2->super_QFragment<3>).size_left_array[0];
      pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_24);
      local_28 = local_28 - (qVar1 + (pQVar2->super_QFragment<3>).size_array[0]);
      pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_24);
      local_24 = (pQVar2->super_QFragment<3>).right;
    }
    else {
      pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_24);
      local_24 = (pQVar2->super_QFragment<3>).left;
    }
  }
  pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
  (pQVar2->super_QFragment<3>).parent = local_20;
  if (local_20 == 0) {
    in_RDI->head->root = index_00;
  }
  else if (bVar3) {
    pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_20);
    (pQVar2->super_QFragment<3>).right = index_00;
  }
  else {
    pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_20);
    (pQVar2->super_QFragment<3>).left = index_00;
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
      qVar1 = (pQVar2->super_QFragment<3>).size_array[local_30];
      pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_20);
      (pQVar2->super_QFragment<3>).size_left_array[local_30] = qVar1;
    }
  }
  while( true ) {
    bVar3 = false;
    if (local_20 != 0) {
      pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_20);
      bVar3 = (pQVar2->super_QFragment<3>).parent != 0;
    }
    if (!bVar3) break;
    pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,local_20);
    index = (pQVar2->super_QFragment<3>).parent;
    pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
    bVar3 = (pQVar2->super_QFragment<3>).left == local_20;
    local_20 = index;
    if (bVar3) {
      for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
        pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index_00);
        qVar1 = (pQVar2->super_QFragment<3>).size_array[local_38];
        pQVar2 = F((QFragmentMapData<QTextBlockData> *)in_RDI,index);
        (pQVar2->super_QFragment<3>).size_left_array[local_38] =
             qVar1 + (pQVar2->super_QFragment<3>).size_left_array[local_38];
      }
    }
  }
  rebalance((QFragmentMapData<QTextBlockData> *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),
            (uint)((ulong)in_RDI >> 0x20));
  return index_00;
}

Assistant:

uint QFragmentMapData<Fragment>::insert_single(int key, uint length)
{
    Q_ASSERT(!findNode(key) || (int)this->position(findNode(key)) == key);

    uint z = createFragment();

    F(z).left = 0;
    F(z).right = 0;
    F(z).size_array[0] = length;
    for (uint field = 1; field < Fragment::size_array_max; ++field)
        F(z).size_array[field] = 1;
    for (uint field = 0; field < Fragment::size_array_max; ++field)
        F(z).size_left_array[field] = 0;

    uint y = 0;
    uint x = root();

    Q_ASSERT(!x || F(x).parent == 0);

    uint s = key;
    bool right = false;
    while (x) {
        y = x;
        if (s <= F(x).size_left_array[0]) {
            x = F(x).left;
            right = false;
        } else {
            s -= F(x).size_left_array[0] + F(x).size_array[0];
            x = F(x).right;
            right = true;
        }
    }

    F(z).parent = y;
    if (!y) {
        head->root = z;
    } else if (!right) {
        F(y).left = z;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_array[field];
    } else {
        F(y).right = z;
    }
    while (y && F(y).parent) {
        uint p = F(y).parent;
        if (F(p).left == y) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] += F(z).size_array[field];
        }
        y = p;
    }
    rebalance(z);

    return z;
}